

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_account(short account_type)

{
  DebitAccount dac;
  Client client;
  ofstream outFile;
  ofstream outFileClient;
  
  std::ofstream::ofstream(&outFileClient);
  client.bdate[8] = '\0';
  client.bdate[9] = '\0';
  client.bdate[0] = '\0';
  client.bdate[1] = '\0';
  client.bdate[2] = '\0';
  client.bdate[3] = '\0';
  client.bdate[4] = '\0';
  client.bdate[5] = '\0';
  client.bdate[6] = '\0';
  client.bdate[7] = '\0';
  std::ofstream::open((char *)&outFileClient,0x105822);
  Client::create_client(&client);
  std::ostream::write((char *)&outFileClient,(long)&client);
  std::ofstream::close();
  std::ofstream::ofstream(&outFile);
  switch(account_type) {
  case 1:
    dac.super_Account._vptr_Account = (_func_int **)&PTR_create_account_00107d00;
    std::ofstream::open((char *)&outFile,0x10513d);
    Account::create_account(&dac.super_Account,1,client.id,client.client_class);
    std::ostream::write((char *)&outFile,(long)&dac);
    std::ofstream::close();
    break;
  case 2:
    dac.super_Account._vptr_Account = (_func_int **)&PTR_create_account_00107cc0;
    std::ofstream::open((char *)&outFile,0x10513d);
    CreditAccount::create_account((CreditAccount *)&dac,client.id,client.client_class);
    std::ostream::write((char *)&outFile,(long)&dac);
    std::ofstream::close();
    break;
  case 3:
    dac.super_Account._vptr_Account = (_func_int **)&PTR_create_account_00107d40;
    std::ofstream::open((char *)&outFile,0x10513d);
    Account::create_account(&dac.super_Account,3,client.id,client.client_class);
    std::ostream::write((char *)&outFile,(long)&dac);
    std::ofstream::close();
    break;
  case 4:
    dac.super_Account._vptr_Account = (_func_int **)&PTR_create_account_00107d80;
    std::ofstream::open((char *)&outFile,0x10513d);
    Account::create_account(&dac.super_Account,4,client.id,client.client_class);
    std::ostream::write((char *)&outFile,(long)&dac);
    std::ofstream::close();
    break;
  default:
    std::operator<<((ostream *)&std::cout,"wrong choice");
  }
  std::ofstream::~ofstream(&outFile);
  std::ofstream::~ofstream(&outFileClient);
  return;
}

Assistant:

void write_account(short account_type)
{
    /*!
     * It is a helper function that writes the proper account details both
     * into Client.dat and Account.dat
     */

    std::ofstream outFileClient;
    Client client;
    outFileClient.open("Client.dat", std::ios::binary|std::ios::app);
    client.create_client();
    outFileClient.write((char *) &client, sizeof(Client));
    outFileClient.close();

    std::ofstream outFile;
    switch (account_type) {
        case 1:
        {
            DebitAccount dac;
            outFile.open("Account.dat",std::ios::binary|std::ios::app);
            dac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &dac, sizeof(Account));
            outFile.close();
            break;
        }


        case 2: {
            CreditAccount cac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            cac.create_account(client.get_client_id(), client.get_client_class());
            outFile.write((char *) &cac, sizeof(Account));
            outFile.close();
            break;
        }
        case 3: {
            BusinessAccount bac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            bac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &bac, sizeof(Account));
            outFile.close();
            break;
        }
        case 4: {
            SavingAccount sac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            sac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &sac, sizeof(Account));
            outFile.close();
            break;
        }

        default :std::cout<<"wrong choice";

    }


}